

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void kratos::VarSourceVisitor::get_source_var
               (Var *var,
               unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
               *set)

{
  __node_base_ptr this;
  VarType VVar1;
  unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
  *__source;
  undefined1 local_98 [8];
  VarComponentVisitor visitor;
  unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
  *set_local;
  Var *var_local;
  
  visitor.vars_._M_h._M_single_bucket = (__node_base_ptr)set;
  VVar1 = Var::type(var);
  if ((VVar1 != ConstValue) && (VVar1 = Var::type(var), VVar1 != Parameter)) {
    VarComponentVisitor::VarComponentVisitor((VarComponentVisitor *)local_98);
    IRVisitor::visit_root((IRVisitor *)local_98,&var->super_IRNode);
    this = visitor.vars_._M_h._M_single_bucket;
    __source = VarComponentVisitor::vars((VarComponentVisitor *)local_98);
    std::
    unordered_set<kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<kratos::Var*>>
    ::merge<std::hash<kratos::Var*>,std::equal_to<kratos::Var*>>
              ((unordered_set<kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<kratos::Var*>>
                *)this,__source);
    VarComponentVisitor::~VarComponentVisitor((VarComponentVisitor *)local_98);
  }
  return;
}

Assistant:

void static get_source_var(const Var *var, std::unordered_set<Var *> &set) {
        if (var->type() == VarType::ConstValue || var->type() == VarType::Parameter) return;
        VarComponentVisitor visitor;
        visitor.visit_root(const_cast<Var *>(var));
        set.merge(visitor.vars());
    }